

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O3

VendorType parseVendor(StringRef VendorName)

{
  int *piVar1;
  
  piVar1 = (int *)VendorName.Data;
  switch(VendorName.Length) {
  case 2:
    if ((short)*piVar1 == 0x6370) {
      return PC;
    }
    return (uint)((short)*piVar1 == 0x656f) << 4;
  case 3:
    if (*(char *)((long)piVar1 + 2) == 'p' && (short)*piVar1 == 0x6762) {
      return BGP;
    }
    if (*(char *)((long)piVar1 + 2) == 'q' && (short)*piVar1 == 0x6762) {
      return BGQ;
    }
    if (*(char *)((long)piVar1 + 2) == 'l' && (short)*piVar1 == 0x7366) {
      return Freescale;
    }
    if (*(char *)((long)piVar1 + 2) == 'm' && (short)*piVar1 == 0x6269) {
      return IBM;
    }
    if (*(char *)((long)piVar1 + 2) == 'g' && (short)*piVar1 == 0x6d69) {
      return ImaginationTechnologies;
    }
    if (*(char *)((long)piVar1 + 2) == 'i' && (short)*piVar1 == 0x746d) {
      return MipsTechnologies;
    }
    if (*(char *)((long)piVar1 + 2) == 'r' && (short)*piVar1 == 0x7363) {
      return CSR;
    }
    if (*(char *)((long)piVar1 + 2) == 'd' && (short)*piVar1 == 0x6d61) {
      return AMD;
    }
    break;
  case 4:
    if (*piVar1 == 0x69656373) {
      return SCEI;
    }
    if (*piVar1 == 0x6173656d) {
      return Mesa;
    }
    if (*piVar1 == 0x65737573) {
      return SUSE;
    }
    break;
  case 5:
    if ((char)piVar1[1] == 'e' && *piVar1 == 0x6c707061) {
      return Apple;
    }
    break;
  case 6:
    if ((short)piVar1[1] == 0x6169 && *piVar1 == 0x6469766e) {
      return NVIDIA;
    }
    if ((short)piVar1[1] == 0x6461 && *piVar1 == 0x6972796d) {
      return Myriad;
    }
  }
  return UnknownVendor;
}

Assistant:

bool equals(StringRef RHS) const {
      return (Length == RHS.Length &&
              compareMemory(Data, RHS.Data, RHS.Length) == 0);
    }